

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void google::protobuf::Type::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  Type *pTVar2;
  char *failure_msg;
  void *pvVar3;
  int iVar4;
  Arena *pAVar5;
  string *psVar6;
  Arena *arena;
  Type *_this;
  allocator<char> local_49;
  Type *local_48;
  string local_40;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_48 = (Type *)to_msg;
  local_40._M_dataplus._M_p = (pointer)from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::Type_const*,google::protobuf::Type*>
                          ((Type **)&local_40,&local_48,"&from != _this");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    RepeatedPtrField<google::protobuf::Field>::MergeFrom
              (&(local_48->field_0)._impl_.fields_,
               (RepeatedPtrField<google::protobuf::Field> *)&from_msg[1]._internal_metadata_);
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::MergeFrom(&(local_48->field_0)._impl_.oneofs_,
                (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(from_msg + 3));
    RepeatedPtrField<google::protobuf::Option>::MergeFrom
              (&(local_48->field_0)._impl_.options_,
               (RepeatedPtrField<google::protobuf::Option> *)&from_msg[4]._internal_metadata_);
    pTVar2 = local_48;
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 1) != 0) {
        psVar6 = (string *)((ulong)from_msg[6]._vptr_MessageLite & 0xfffffffffffffffc);
        if (psVar6->_M_string_length == 0) {
          if (((ulong)(local_48->field_0)._impl_.name_.tagged_ptr_.ptr_ & 3) == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_40,anon_var_dwarf_651463 + 5,&local_49);
            *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
            pAVar5 = (Arena *)(pTVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
            if (((ulong)pAVar5 & 1) != 0) {
              pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
            }
            internal::ArenaStringPtr::Set<>(&(pTVar2->field_0)._impl_.name_,&local_40,pAVar5);
            std::__cxx11::string::~string((string *)&local_40);
          }
        }
        else {
          *(byte *)&local_48->field_0 = *(byte *)&local_48->field_0 | 1;
          pAVar5 = (Arena *)(local_48->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar5 & 1) != 0) {
            pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
          }
          internal::ArenaStringPtr::Set<>(&(local_48->field_0)._impl_.name_,psVar6,pAVar5);
        }
      }
      pTVar2 = local_48;
      if ((uVar1 & 2) != 0) {
        psVar6 = (string *)(from_msg[6]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
        if (psVar6->_M_string_length == 0) {
          if (((ulong)(local_48->field_0)._impl_.edition_.tagged_ptr_.ptr_ & 3) == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_40,anon_var_dwarf_651463 + 5,&local_49);
            *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 2;
            pAVar5 = (Arena *)(pTVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
            if (((ulong)pAVar5 & 1) != 0) {
              pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
            }
            internal::ArenaStringPtr::Set<>(&(pTVar2->field_0)._impl_.edition_,&local_40,pAVar5);
            std::__cxx11::string::~string((string *)&local_40);
          }
        }
        else {
          *(byte *)&local_48->field_0 = *(byte *)&local_48->field_0 | 2;
          pAVar5 = (Arena *)(local_48->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar5 & 1) != 0) {
            pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
          }
          internal::ArenaStringPtr::Set<>(&(local_48->field_0)._impl_.edition_,psVar6,pAVar5);
        }
      }
      if ((uVar1 & 4) != 0) {
        from_msg_00 = (MessageLite *)from_msg[7]._vptr_MessageLite;
        if (from_msg_00 == (MessageLite *)0x0) {
          failure_msg = "from._impl_.source_context_ != nullptr";
          iVar4 = 0x348;
          goto LAB_00bd5db1;
        }
        to_msg_00 = *(MessageLite **)((long)&local_48->field_0 + 0x60);
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar3 = Arena::CopyConstruct<google::protobuf::SourceContext>(arena,from_msg_00);
          *(void **)((long)&local_48->field_0 + 0x60) = pvVar3;
        }
        else {
          SourceContext::MergeImpl(to_msg_00,from_msg_00);
        }
      }
      if (((uVar1 & 8) != 0) && (iVar4 = (int)from_msg[7]._internal_metadata_.ptr_, iVar4 != 0)) {
        *(int *)((long)&local_48->field_0 + 0x68) = iVar4;
      }
    }
    (local_48->field_0)._impl_._has_bits_.has_bits_[0] =
         (local_48->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(local_48->super_Message).super_MessageLite._internal_metadata_,
               &from_msg->_internal_metadata_);
    return;
  }
  iVar4 = 0x32a;
LAB_00bd5db1:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/type.pb.cc"
             ,iVar4,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

void Type::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Type*>(&to_msg);
  auto& from = static_cast<const Type&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Type)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_fields()->MergeFrom(
      from._internal_fields());
  _this->_internal_mutable_oneofs()->MergeFrom(from._internal_oneofs());
  _this->_internal_mutable_options()->MergeFrom(
      from._internal_options());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_name().empty()) {
        _this->_internal_set_name(from._internal_name());
      } else {
        if (_this->_impl_.name_.IsDefault()) {
          _this->_internal_set_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_edition().empty()) {
        _this->_internal_set_edition(from._internal_edition());
      } else {
        if (_this->_impl_.edition_.IsDefault()) {
          _this->_internal_set_edition("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(from._impl_.source_context_ != nullptr);
      if (_this->_impl_.source_context_ == nullptr) {
        _this->_impl_.source_context_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.source_context_);
      } else {
        _this->_impl_.source_context_->MergeFrom(*from._impl_.source_context_);
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (from._internal_syntax() != 0) {
        _this->_impl_.syntax_ = from._impl_.syntax_;
      }
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}